

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O3

JsErrorCode JsGetDataViewStorage(JsValueRef instance,BYTE **buffer,uint *bufferLength)

{
  bool bVar1;
  int iVar2;
  DataView *pDVar3;
  undefined4 extraout_var;
  JsErrorCode JVar4;
  DebugCheckNoException local_30;
  
  if (instance == (JsValueRef)0x0) {
    JVar4 = JsErrorInvalidArgument;
  }
  else {
    JVar4 = JsErrorNullArgument;
    if (bufferLength != (uint *)0x0 && buffer != (BYTE **)0x0) {
      local_30.hasException = true;
      local_30.__exceptionCheck = ExceptionCheck::Save();
      bVar1 = Js::VarIs<Js::DataView>(instance);
      JVar4 = JsErrorInvalidArgument;
      if (bVar1) {
        pDVar3 = Js::VarTo<Js::DataView>(instance);
        iVar2 = (*(((pDVar3->super_ArrayBufferParent).arrayBuffer.ptr)->super_DynamicObject).
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])();
        *buffer = (BYTE *)(CONCAT44(extraout_var,iVar2) + (ulong)pDVar3->byteOffset);
        *bufferLength = (pDVar3->super_ArrayBufferParent).super_ArrayObject.length;
        JVar4 = JsNoError;
      }
      local_30.hasException = false;
      DebugCheckNoException::~DebugCheckNoException(&local_30);
    }
  }
  return JVar4;
}

Assistant:

END_JSRT_NO_EXCEPTION
}

CHAKRA_API JsGetDataViewStorage(_In_ JsValueRef instance, _Outptr_result_bytebuffer_(*bufferLength) BYTE **buffer, _Out_ unsigned int *bufferLength)
{
    VALIDATE_JSREF(instance);
    PARAM_NOT_NULL(buffer);
    PARAM_NOT_NULL(bufferLength);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (!Js::VarIs<Js::DataView>(instance))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        Js::DataView* dataView = Js::VarTo<Js::DataView>(instance);
        *buffer = dataView->GetArrayBuffer()->GetBuffer() + dataView->GetByteOffset();
        *bufferLength = dataView->GetLength();
    }